

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp3_qpack.c
# Opt level: O0

void nghttp3_qpack_encoder_unblock(nghttp3_qpack_encoder *encoder,uint64_t max_cnt)

{
  bool bVar1;
  nghttp3_ksl_it it;
  nghttp3_blocked_streams_key bsk;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  nghttp3_ksl *in_stack_ffffffffffffffb0;
  nghttp3_ksl_it *in_stack_ffffffffffffffb8;
  nghttp3_ksl_it *hint;
  nghttp3_ksl_it *in_stack_ffffffffffffffc0;
  nghttp3_ksl_it *it_00;
  nghttp3_ksl *ksl;
  
  nghttp3_ksl_lower_bound
            (in_stack_ffffffffffffffb0,
             (nghttp3_ksl_key *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
  hint = in_stack_ffffffffffffffb8;
  it_00 = in_stack_ffffffffffffffc0;
  ksl = in_stack_ffffffffffffffb0;
  while( true ) {
    bVar1 = false;
    if ((nghttp3_ksl_it *)(ulong)(uint)in_stack_ffffffffffffffb8->i == in_stack_ffffffffffffffc0) {
      bVar1 = in_stack_ffffffffffffffb8->ksl == (nghttp3_ksl *)0x0;
    }
    if (bVar1) break;
    nghttp3_ksl_remove_hint(ksl,it_00,hint,in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

void nghttp3_qpack_encoder_unblock(nghttp3_qpack_encoder *encoder,
                                   uint64_t max_cnt) {
  nghttp3_blocked_streams_key bsk = {
    .max_cnt = max_cnt,
  };
  nghttp3_ksl_it it;

  it = nghttp3_ksl_lower_bound(&encoder->blocked_streams, &bsk);

  for (; !nghttp3_ksl_it_end(&it);) {
    bsk = *(nghttp3_blocked_streams_key *)nghttp3_ksl_it_key(&it);
    nghttp3_ksl_remove_hint(&encoder->blocked_streams, &it, &it, &bsk);
  }
}